

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

void __thiscall Log::Add(Log *this,string *message)

{
  pointer pcVar1;
  _func_void_string *p_Var2;
  string sVar3;
  long *plVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 *puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff88;
  long *local_60;
  long local_50;
  long lStack_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pcVar1 = (this->_logText)._M_dataplus._M_p;
  puVar6 = &stack0xffffffffffffff90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff80,pcVar1,pcVar1 + (this->_logText)._M_string_length);
  std::__cxx11::string::append((char *)&stack0xffffffffffffff80);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             (&stack0xffffffffffffff80,(ulong)(message->_M_dataplus)._M_p);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_50 = *plVar5;
    lStack_48 = plVar4[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar5;
    local_60 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if (puVar6 != &stack0xffffffffffffff90) {
    operator_delete(puVar6);
  }
  p_Var2 = this->_printFunction;
  if (p_Var2 != (_func_void_string *)0x0) {
    pcVar1 = (message->_M_dataplus)._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar1,pcVar1 + message->_M_string_length);
    sVar3._M_string_length = (size_type)puVar6;
    sVar3._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff78;
    sVar3.field_2 = in_stack_ffffffffffffff88;
    (*p_Var2)(sVar3);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  return;
}

Assistant:

void Log::Add(string message) {
  _logText + "\n" + message;
  if (_printFunction != nullptr) {
    _printFunction(message);
  }
}